

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O2

bool Assimp::PLY::PropertyInstance::ParseValueBinary
               (IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
               char **pCur,uint *bufferSize,EDataType eType,ValueUnion *out,bool p_bBE)

{
  ushort uVar1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __last;
  ValueUnion VVar2;
  ushort uVar3;
  bool bVar4;
  uint uVar5;
  byte *pbVar6;
  DeadlyImportError *this;
  uint uVar7;
  uint uVar8;
  ValueUnion VVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  allocator_type local_7d;
  uint local_7c;
  vector<char,_std::allocator<char>_> nbuffer;
  string local_50;
  
  if (out == (ValueUnion *)0x0) {
    __assert_fail("__null != out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyParser.cpp"
                  ,0x3e0,
                  "static bool Assimp::PLY::PropertyInstance::ParseValueBinary(IOStreamBuffer<char> &, std::vector<char> &, const char *&, unsigned int &, PLY::EDataType, PLY::PropertyInstance::ValueUnion *, bool)"
                 );
  }
  local_7c = 0;
  if ((eType < EDT_INVALID) &&
     (local_7c = *(uint *)(&DAT_005e0ec0 + (ulong)eType * 4), *bufferSize < local_7c)) {
    nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar4 = IOStreamBuffer<char>::getNextBlock(streamBuffer,&nbuffer);
    if (!bVar4) {
      this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Invalid .ply file: File corrupted",&local_7d);
      DeadlyImportError::DeadlyImportError(this,&local_50);
      __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    __last._M_current =
         (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    std::vector<char,std::allocator<char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((vector<char,std::allocator<char>> *)&local_50,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               (__last._M_current + -(ulong)*bufferSize),__last,&local_7d);
    std::vector<char,_std::allocator<char>_>::_M_move_assign(buffer,&local_50);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&local_50);
    std::vector<char,std::allocator<char>>::
    insert<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((vector<char,std::allocator<char>> *)buffer,
               (const_iterator)
               (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    if (nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = nbuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    *bufferSize = *(int *)&(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                  *(int *)&(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                           super__Vector_impl_data._M_start;
    *pCur = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start;
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&nbuffer.super__Vector_base<char,_std::allocator<char>_>);
  }
  switch((ulong)eType) {
  case 0:
    pbVar6 = (byte *)*pCur;
    uVar8 = (uint)(char)*pbVar6;
    goto LAB_0046e4f2;
  case 1:
    pbVar6 = (byte *)*pCur;
    uVar8 = (uint)*pbVar6;
LAB_0046e4f2:
    *pCur = (char *)(pbVar6 + 1);
    break;
  case 2:
    uVar1 = *(ushort *)*pCur;
    *pCur = (char *)((long)*pCur + 2);
    uVar3 = uVar1 >> 8;
    if (!p_bBE) {
      uVar3 = uVar1;
      uVar1 = uVar1 >> 8;
    }
    uVar5 = (uint)(short)(uVar3 & 0xff | uVar1 << 8);
    goto LAB_0046e4df;
  case 3:
    uVar1 = *(ushort *)*pCur;
    *pCur = (char *)((long)*pCur + 2);
    uVar5 = (uint)(uVar1 >> 8);
    if (p_bBE) {
      uVar5 = (uint)uVar1;
    }
    uVar8 = (uint)(uVar1 >> 8);
    if (!p_bBE) {
      uVar8 = (uint)uVar1;
    }
    uVar5 = uVar8 & 0xff | (uVar5 & 0xff) << 8;
LAB_0046e4df:
    out->iUInt = uVar5;
    goto LAB_0046e512;
  case 4:
  case 5:
    uVar5 = *(uint *)*pCur;
    uVar12 = uVar5 >> 8;
    uVar10 = uVar5 >> 0x10;
    uVar7 = uVar5 >> 0x18;
    *pCur = (char *)((long)*pCur + 4);
    uVar8 = uVar12;
    if (p_bBE) {
      uVar11 = uVar5 & 0xff;
      uVar8 = uVar10;
      uVar5 = uVar7;
      uVar7 = uVar11;
      uVar10 = uVar12;
    }
    uVar8 = uVar5 & 0xff | (uVar8 & 0xff) << 8 | (uVar10 & 0xff) << 0x10 | uVar7 << 0x18;
    break;
  case 6:
    uVar5 = *(uint *)*pCur;
    *pCur = (char *)((long)*pCur + 4);
    uVar8 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    if (!p_bBE) {
      uVar8 = uVar5;
    }
    break;
  case 7:
    VVar2 = *(ValueUnion *)&((ValueUnion *)*pCur)->iUInt;
    *pCur = (char *)((ValueUnion *)*pCur + 1);
    VVar9 = (ValueUnion)
            ((ulong)VVar2 >> 0x38 | ((ulong)VVar2 & 0xff000000000000) >> 0x28 |
             ((ulong)VVar2 & 0xff0000000000) >> 0x18 | ((ulong)VVar2 & 0xff00000000) >> 8 |
             ((ulong)VVar2 & 0xff000000) << 8 | ((ulong)VVar2 & 0xff0000) << 0x18 |
             ((ulong)VVar2 & 0xff00) << 0x28 | (long)VVar2 << 0x38);
    if (!p_bBE) {
      VVar9 = VVar2;
    }
    *out = VVar9;
    goto LAB_0046e512;
  default:
    bVar4 = false;
    goto LAB_0046e514;
  }
  out->iUInt = uVar8;
LAB_0046e512:
  bVar4 = true;
LAB_0046e514:
  *bufferSize = *bufferSize - local_7c;
  return bVar4;
}

Assistant:

bool PLY::PropertyInstance::ParseValueBinary(IOStreamBuffer<char> &streamBuffer,
  std::vector<char> &buffer,
  const char* &pCur,
  unsigned int &bufferSize,
  PLY::EDataType eType,
  PLY::PropertyInstance::ValueUnion* out,
  bool p_bBE)
{
  ai_assert(NULL != out);

  //calc element size
  unsigned int lsize = 0;
  switch (eType)
  {
  case EDT_Char:
  case EDT_UChar:
    lsize = 1;
    break;

  case EDT_UShort:
  case EDT_Short:
    lsize = 2;
    break;

  case EDT_UInt:
  case EDT_Int:
  case EDT_Float:
    lsize = 4;
    break;

  case EDT_Double:
    lsize = 8;
    break;

  case EDT_INVALID:
  default:
      break;
  }

  //read the next file block if needed
  if (bufferSize < lsize)
  {
    std::vector<char> nbuffer;
    if (streamBuffer.getNextBlock(nbuffer))
    {
      //concat buffer contents
      buffer = std::vector<char>(buffer.end() - bufferSize, buffer.end());
      buffer.insert(buffer.end(), nbuffer.begin(), nbuffer.end());
      nbuffer.clear();
      bufferSize = static_cast<unsigned int>(buffer.size());
      pCur = (char*)&buffer[0];
    }
    else
    {
      throw DeadlyImportError("Invalid .ply file: File corrupted");
    }
  }

  bool ret = true;
  switch (eType)
  {
  case EDT_UInt:
  {
    uint32_t t;
    memcpy(&t, pCur, sizeof(uint32_t));
    pCur += sizeof(uint32_t);

    // Swap endianness
    if (p_bBE)ByteSwap::Swap(&t);
    out->iUInt = t;
    break;
  }

  case EDT_UShort:
  {
    uint16_t t;
    memcpy(&t, pCur, sizeof(uint16_t));
    pCur += sizeof(uint16_t);

    // Swap endianness
    if (p_bBE)ByteSwap::Swap(&t);
    out->iUInt = t;
    break;
  }

  case EDT_UChar:
  {
    uint8_t t;
    memcpy(&t, pCur, sizeof(uint8_t));
    pCur += sizeof(uint8_t);
    out->iUInt = t;
    break;
  }

  case EDT_Int:
  {
    int32_t t;
    memcpy(&t, pCur, sizeof(int32_t));
    pCur += sizeof(int32_t);

    // Swap endianness
    if (p_bBE)ByteSwap::Swap(&t);
    out->iInt = t;
    break;
  }

  case EDT_Short:
  {
    int16_t t;
    memcpy(&t, pCur, sizeof(int16_t));
    pCur += sizeof(int16_t);

    // Swap endianness
    if (p_bBE)ByteSwap::Swap(&t);
    out->iInt = t;
    break;
  }

  case EDT_Char:
  {
    int8_t t;
    memcpy(&t, pCur, sizeof(int8_t));
    pCur += sizeof(int8_t);
    out->iInt = t;
    break;
  }

  case EDT_Float:
  {
    float t;
    memcpy(&t, pCur, sizeof(float));
    pCur += sizeof(float);

    // Swap endianness
    if (p_bBE)ByteSwap::Swap(&t);
    out->fFloat = t;
    break;
  }
  case EDT_Double:
  {
    double t;
    memcpy(&t, pCur, sizeof(double));
    pCur += sizeof(double);

    // Swap endianness
    if (p_bBE)ByteSwap::Swap(&t);
    out->fDouble = t;
    break;
  }
  default:
    ret = false;
  }

  bufferSize -= lsize;

  return ret;
}